

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_vpeconf0_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint local_1c;
  uint32_t newval;
  uint32_t mask;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  local_1c = 0;
  if ((env->CP0_VPEConf0 & 2U) != 0) {
    if ((env->CP0_VPEConf0 & 1U) != 0) {
      local_1c = 0x1fe00000;
    }
    local_1c = local_1c | 3;
  }
  env->CP0_VPEConf0 = env->CP0_VPEConf0 & (local_1c ^ 0xffffffff) | (uint)arg1 & local_1c;
  return;
}

Assistant:

void helper_mtc0_vpeconf0(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) {
        if (env->CP0_VPEConf0 & (1 << CP0VPEC0_VPA)) {
            mask |= (0xff << CP0VPEC0_XTC);
        }
        mask |= (1 << CP0VPEC0_MVP) | (1 << CP0VPEC0_VPA);
    }
    newval = (env->CP0_VPEConf0 & ~mask) | (arg1 & mask);

    /* TODO: TC exclusive handling due to ERL/EXL. */

    env->CP0_VPEConf0 = newval;
}